

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::GenerateInstallRules(cmLocalGenerator *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  __type _Var3;
  char *pcVar4;
  ostream *poVar5;
  char *pcVar6;
  pointer this_00;
  string *s;
  pointer ppcVar7;
  char **c;
  undefined **ppuVar8;
  allocator local_389;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  Directory local_368;
  vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> children;
  string default_config;
  string local_2f8;
  string homedir;
  string file;
  string odir;
  cmGeneratedFileStream fout;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&fout,"CMAKE_INSTALL_PREFIX",(allocator *)&local_368);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  pcVar6 = "/usr/local";
  if (pcVar4 != (char *)0x0) {
    pcVar6 = pcVar4;
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&fout,"CMAKE_STAGING_PREFIX",(allocator *)&local_368);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  if (pcVar4 != (char *)0x0) {
    pcVar6 = pcVar4;
  }
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_2f8,this->Makefile,&configurationTypes,false);
  std::__cxx11::string::string((string *)&default_config,(string *)&local_2f8);
  ppuVar8 = &PTR_anon_var_dwarf_38d955_00685c40;
  while ((pcVar4 = *ppuVar8, pcVar4 != (char *)0x0 &&
         (s = configurationTypes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start, default_config._M_string_length == 0))) {
    for (; s != configurationTypes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
      cmsys::SystemTools::UpperCase((string *)&fout,s);
      bVar2 = std::operator==((string *)&fout,pcVar4);
      std::__cxx11::string::~string((string *)&fout);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)&default_config);
      }
    }
    ppuVar8 = ppuVar8 + 1;
  }
  if ((default_config._M_string_length == 0) &&
     (configurationTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      configurationTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::string::_M_assign((string *)&default_config);
  }
  cmState::Snapshot::GetDirectory((Directory *)&fout,&this->StateSnapshot);
  pcVar4 = cmState::Directory::GetCurrentBinary((Directory *)&fout);
  std::__cxx11::string::string((string *)&file,pcVar4,(allocator *)&local_368);
  pcVar4 = cmState::GetBinaryDirectory(this->GlobalGenerator->CMakeInstance->State);
  std::__cxx11::string::string((string *)&homedir,pcVar4,(allocator *)&fout);
  _Var3 = std::operator==(&file,&homedir);
  std::__cxx11::string::append((char *)&file);
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,file._M_dataplus._M_p,false);
  cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
  poVar5 = std::operator<<((ostream *)&fout,"# Install script for directory: ");
  cmState::Snapshot::GetDirectory(&local_368,&this->StateSnapshot);
  pcVar4 = cmState::Directory::GetCurrentSource(&local_368);
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&fout,"# Set the install prefix");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"if(NOT DEFINED CMAKE_INSTALL_PREFIX)");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"  set(CMAKE_INSTALL_PREFIX \"");
  poVar5 = std::operator<<(poVar5,pcVar6);
  poVar5 = std::operator<<(poVar5,"\")");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"endif()");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(poVar5,"string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX ");
  poVar5 = std::operator<<(poVar5,"\"${CMAKE_INSTALL_PREFIX}\")");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&fout,
                           "# Set the install configuration name.\nif(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n  if(BUILD_TYPE)\n    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n  else()\n    set(CMAKE_INSTALL_CONFIG_NAME \""
                          );
  poVar5 = std::operator<<(poVar5,(string *)&default_config);
  std::operator<<(poVar5,
                  "\")\n  endif()\n  message(STATUS \"Install configuration: \\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\nendif()\n\n"
                 );
  std::operator<<((ostream *)&fout,
                  "# Set the component getting installed.\nif(NOT CMAKE_INSTALL_COMPONENT)\n  if(COMPONENT)\n    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n  else()\n    set(CMAKE_INSTALL_COMPONENT)\n  endif()\nendif()\n\n"
                 );
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&local_368,"CMAKE_INSTALL_SO_NO_EXE",(allocator *)&odir);
  pcVar6 = cmMakefile::GetDefinition(pcVar1,(string *)&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  if (pcVar6 != (char *)0x0) {
    poVar5 = std::operator<<((ostream *)&fout,
                             "# Install shared libraries without execute permission?\nif(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n  set(CMAKE_INSTALL_SO_NO_EXE \""
                            );
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  for (ppcVar7 = (pcVar1->InstallGenerators).
                 super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar7 !=
      (pcVar1->InstallGenerators).
      super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar7 = ppcVar7 + 1) {
    cmScriptGenerator::Generate
              (&(*ppcVar7)->super_cmScriptGenerator,(ostream *)&fout,&local_2f8,&configurationTypes)
    ;
  }
  GenerateTargetInstallRules(this,(ostream *)&fout,&local_2f8,&configurationTypes);
  cmMakefile::GetStateSnapshot(this->Makefile);
  cmState::Snapshot::GetChildren(&children,(Snapshot *)&local_368);
  if (children.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
      super__Vector_impl_data._M_start !=
      children.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::operator<<((ostream *)&fout,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n");
    std::operator<<((ostream *)&fout,"  # Include the install script for each subdirectory.\n");
    for (this_00 = children.
                   super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl
                   .super__Vector_impl_data._M_start;
        this_00 !=
        children.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
        super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      cmState::Snapshot::GetDirectory(&local_368,this_00);
      std::__cxx11::string::string((string *)&odir,"EXCLUDE_FROM_ALL",&local_389);
      bVar2 = cmState::Directory::GetPropertyAsBool(&local_368,&odir);
      std::__cxx11::string::~string((string *)&odir);
      if (!bVar2) {
        cmState::Snapshot::GetDirectory(&local_368,this_00);
        pcVar6 = cmState::Directory::GetCurrentBinary(&local_368);
        std::__cxx11::string::string((string *)&odir,pcVar6,&local_389);
        cmsys::SystemTools::ConvertToUnixSlashes(&odir);
        poVar5 = std::operator<<((ostream *)&fout,"  include(\"");
        poVar5 = std::operator<<(poVar5,(string *)&odir);
        poVar5 = std::operator<<(poVar5,"/cmake_install.cmake\")");
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&odir);
      }
    }
    std::operator<<((ostream *)&fout,"\n");
    std::operator<<((ostream *)&fout,"endif()\n\n");
  }
  if (_Var3) {
    poVar5 = std::operator<<((ostream *)&fout,
                             "if(CMAKE_INSTALL_COMPONENT)\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest_${CMAKE_INSTALL_COMPONENT}.txt\")\nelse()\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\nendif()\n\nstring(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\nfile(WRITE \""
                            );
    poVar5 = std::operator<<(poVar5,(string *)&homedir);
    std::operator<<(poVar5,
                    "/${CMAKE_INSTALL_MANIFEST}\"\n     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n");
  }
  std::_Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::~_Vector_base
            (&children.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>);
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::__cxx11::string::~string((string *)&homedir);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&default_config);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configurationTypes);
  return;
}

Assistant:

void cmLocalGenerator::GenerateInstallRules()
{
  // Compute the install prefix.
  const char* prefix = this->Makefile->GetDefinition("CMAKE_INSTALL_PREFIX");
#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string prefix_win32;
  if(!prefix)
    {
    if(!cmSystemTools::GetEnv("SystemDrive", prefix_win32))
      {
      prefix_win32 = "C:";
      }
    const char* project_name = this->Makefile->GetDefinition("PROJECT_NAME");
    if(project_name && project_name[0])
      {
      prefix_win32 += "/Program Files/";
      prefix_win32 += project_name;
      }
    else
      {
      prefix_win32 += "/InstalledCMakeProject";
      }
    prefix = prefix_win32.c_str();
    }
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (!prefix)
    {
    if (find_directory(B_SYSTEM_DIRECTORY, -1, false, dir, sizeof(dir))
        == B_OK)
      {
      prefix = dir;
      }
    else
      {
      prefix = "/boot/system";
      }
    }
#else
  if (!prefix)
    {
    prefix = "/usr/local";
    }
#endif
  if (const char *stagingPrefix
                  = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX"))
    {
    prefix = stagingPrefix;
    }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  // Choose a default install configuration.
  std::string default_config = config;
  const char* default_order[] = {"RELEASE", "MINSIZEREL",
                                 "RELWITHDEBINFO", "DEBUG", 0};
  for(const char** c = default_order; *c && default_config.empty(); ++c)
    {
    for(std::vector<std::string>::iterator i = configurationTypes.begin();
        i != configurationTypes.end(); ++i)
      {
      if(cmSystemTools::UpperCase(*i) == *c)
        {
        default_config = *i;
        }
      }
    }
  if(default_config.empty() && !configurationTypes.empty())
    {
    default_config = configurationTypes[0];
    }

  // Create the install script file.
  std::string file =
      this->StateSnapshot.GetDirectory().GetCurrentBinary();
  std::string homedir = this->GetState()->GetBinaryDirectory();
  int toplevel_install = 0;
  if (file == homedir)
    {
    toplevel_install = 1;
    }
  file += "/cmake_install.cmake";
  cmGeneratedFileStream fout(file.c_str());
  fout.SetCopyIfDifferent(true);

  // Write the header.
  fout << "# Install script for directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource()
       << std::endl << std::endl;
  fout << "# Set the install prefix" << std::endl
       << "if(NOT DEFINED CMAKE_INSTALL_PREFIX)" << std::endl
       << "  set(CMAKE_INSTALL_PREFIX \"" << prefix << "\")" << std::endl
       << "endif()" << std::endl
       << "string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX "
       << "\"${CMAKE_INSTALL_PREFIX}\")" << std::endl
       << std::endl;

  // Write support code for generating per-configuration install rules.
  fout <<
    "# Set the install configuration name.\n"
    "if(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n"
    "  if(BUILD_TYPE)\n"
    "    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n"
    "           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_CONFIG_NAME \"" << default_config << "\")\n"
    "  endif()\n"
    "  message(STATUS \"Install configuration: "
    "\\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\n"
    "endif()\n"
    "\n";

  // Write support code for dealing with component-specific installs.
  fout <<
    "# Set the component getting installed.\n"
    "if(NOT CMAKE_INSTALL_COMPONENT)\n"
    "  if(COMPONENT)\n"
    "    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n"
    "    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_COMPONENT)\n"
    "  endif()\n"
    "endif()\n"
    "\n";

  // Copy user-specified install options to the install code.
  if(const char* so_no_exe =
     this->Makefile->GetDefinition("CMAKE_INSTALL_SO_NO_EXE"))
    {
    fout <<
      "# Install shared libraries without execute permission?\n"
      "if(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n"
      "  set(CMAKE_INSTALL_SO_NO_EXE \"" << so_no_exe << "\")\n"
      "endif()\n"
      "\n";
    }

  // Ask each install generator to write its code.
  std::vector<cmInstallGenerator*> const& installers =
    this->Makefile->GetInstallGenerators();
  for(std::vector<cmInstallGenerator*>::const_iterator
        gi = installers.begin();
      gi != installers.end(); ++gi)
    {
    (*gi)->Generate(fout, config, configurationTypes);
    }

  // Write rules from old-style specification stored in targets.
  this->GenerateTargetInstallRules(fout, config, configurationTypes);

  // Include install scripts from subdirectories.
  std::vector<cmState::Snapshot> children
      = this->Makefile->GetStateSnapshot().GetChildren();
  if(!children.empty())
    {
    fout << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n";
    fout << "  # Include the install script for each subdirectory.\n";
    for(std::vector<cmState::Snapshot>::const_iterator
          ci = children.begin(); ci != children.end(); ++ci)
      {
      if(!ci->GetDirectory().GetPropertyAsBool("EXCLUDE_FROM_ALL"))
        {
        std::string odir = ci->GetDirectory().GetCurrentBinary();
        cmSystemTools::ConvertToUnixSlashes(odir);
        fout << "  include(\"" <<  odir
             << "/cmake_install.cmake\")" << std::endl;
        }
      }
    fout << "\n";
    fout << "endif()\n\n";
    }

  // Record the install manifest.
  if ( toplevel_install )
    {
    fout <<
      "if(CMAKE_INSTALL_COMPONENT)\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest_"
      "${CMAKE_INSTALL_COMPONENT}.txt\")\n"
      "else()\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\n"
      "endif()\n"
      "\n"
      "string(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n"
      "       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\n"
      "file(WRITE \"" << homedir << "/${CMAKE_INSTALL_MANIFEST}\"\n"
      "     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n";
    }
}